

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ES5ArrayTypeHandler.cpp
# Opt level: O2

BOOL __thiscall
Js::ES5ArrayTypeHandlerBase<int>::UpdateAttribute
          (ES5ArrayTypeHandlerBase<int> *this,DynamicObject *instance,PropertyId propertyId,
          PropertyAttributes attr,BOOL value,BOOL *isNumericPropertyId)

{
  byte bVar1;
  bool bVar2;
  byte bVar3;
  BOOL BVar4;
  ES5Array *arr;
  PrototypeChainCache<Js::OnlyWritablePropertyCache> *local_60 [3];
  IndexPropertyDescriptor *local_48;
  IndexPropertyDescriptor *descriptor;
  uint32 local_34 [2];
  uint32 index;
  
  BVar4 = ScriptContext::IsNumericPropertyId
                    ((((((instance->super_RecyclableObject).type.ptr)->javascriptLibrary).ptr)->
                     super_JavascriptLibraryBase).scriptContext.ptr,propertyId,local_34);
  *isNumericPropertyId = BVar4;
  if (BVar4 == 0) {
LAB_00c4344d:
    BVar4 = 0;
  }
  else {
    bVar2 = IndexPropertyDescriptorMap::TryGetReference
                      ((this->indexPropertyMap).ptr,local_34[0],&local_48);
    if (bVar2) {
      bVar3 = local_48->Attributes;
      if ((bVar3 & 8) != 0) goto LAB_00c4344d;
      if (value != 0) {
        local_48->Attributes = bVar3 | attr;
        return 1;
      }
      bVar3 = bVar3 & ~attr;
      local_48->Attributes = bVar3;
    }
    else {
      arr = VarTo<Js::ES5Array,Js::DynamicObject>(instance);
      BVar4 = HasDataItem(this,arr,local_34[0]);
      if (BVar4 == 0) goto LAB_00c4344d;
      bVar1 = this->dataItemAttributes;
      bVar3 = bVar1 | attr;
      if (value == 0) {
        bVar3 = ~attr & bVar1;
      }
      if (bVar3 == bVar1) {
        return 1;
      }
      descriptor = (IndexPropertyDescriptor *)(this->indexPropertyMap).ptr;
      IndexPropertyDescriptor::IndexPropertyDescriptor
                ((IndexPropertyDescriptor *)local_60,bVar3,(Var)0x0,(Var)0x0);
      IndexPropertyDescriptorMap::Add
                ((IndexPropertyDescriptorMap *)descriptor,local_34[0],
                 (IndexPropertyDescriptor *)local_60);
    }
    BVar4 = 1;
    if ((bVar3 & 4) == 0) {
      BVar4 = 1;
      DynamicTypeHandler::ClearHasOnlyWritableDataProperties((DynamicTypeHandler *)this);
      if (((this->super_DictionaryTypeHandlerBase<int>).super_DynamicTypeHandler.flags & 0x20) != 0)
      {
        Memory::WriteBarrierPtr<Js::PrototypeChainCache<Js::OnlyWritablePropertyCache>_>::
        WriteBarrierSet((WriteBarrierPtr<Js::PrototypeChainCache<Js::OnlyWritablePropertyCache>_> *)
                        local_60,&((((instance->super_RecyclableObject).type.ptr)->javascriptLibrary
                                   ).ptr)->typesWithOnlyWritablePropertyProtoChain);
        PrototypeChainCache<Js::OnlyWritablePropertyCache>::Clear(local_60[0]);
      }
    }
  }
  return BVar4;
}

Assistant:

BOOL ES5ArrayTypeHandlerBase<T>::UpdateAttribute(DynamicObject* instance, PropertyId propertyId, PropertyAttributes attr, BOOL value, BOOL& isNumericPropertyId)
    {
        ScriptContext* scriptContext = instance->GetScriptContext();

        uint32 index;
        isNumericPropertyId = scriptContext->IsNumericPropertyId(propertyId, &index);
        if (isNumericPropertyId)
        {
            IndexPropertyDescriptor* descriptor;
            if (indexPropertyMap->TryGetReference(index, &descriptor))
            {
                if (descriptor->Attributes & PropertyDeleted)
                {
                    return false;
                }

                if (value)
                {
                    descriptor->Attributes |= attr;
                }
                else
                {
                    descriptor->Attributes &= (~attr);
                    if (!(descriptor->Attributes & PropertyWritable))
                    {
                        this->ClearHasOnlyWritableDataProperties();
                        if(this->GetFlags() & this->IsPrototypeFlag)
                        {
                            instance->GetLibrary()->GetTypesWithOnlyWritablePropertyProtoChainCache()->Clear();
                        }
                    }
                }
            }
            else
            {
                if (!HasDataItem(VarTo<ES5Array>(instance), index))
                {
                    return false;
                }

                PropertyAttributes newAttr = GetDataItemAttributes();
                if (value)
                {
                    newAttr |= attr;
                }
                else
                {
                    newAttr &= (~attr);
                }

                if (newAttr != GetDataItemAttributes())
                {
                    indexPropertyMap->Add(index, IndexPropertyDescriptor(newAttr));
                    if (!(newAttr & PropertyWritable))
                    {
                        this->ClearHasOnlyWritableDataProperties();
                        if(this->GetFlags() & this->IsPrototypeFlag)
                        {
                            instance->GetLibrary()->GetTypesWithOnlyWritablePropertyProtoChainCache()->Clear();
                        }
                    }
                }
            }

            return true;
        }

        return false;
    }